

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O0

CEPlanet * __thiscall CEPlanet::operator=(CEPlanet *this,CEPlanet *other)

{
  CEPlanet *in_RSI;
  CEPlanet *in_RDI;
  CEPlanet *in_stack_00000060;
  
  if (in_RDI != in_RSI) {
    CEBody::operator=(&in_RSI->super_CEBody,&in_RDI->super_CEBody);
    free_members(in_RSI);
    init_members(in_stack_00000060);
    copy_members(this,other);
  }
  return in_RDI;
}

Assistant:

CEPlanet& CEPlanet::operator=(const CEPlanet& other)
{
    if (this != &other) {
        // Copy parent class members
        this->CEBody::operator=(other);

        free_members();
        init_members();
        copy_members(other);
    }
    return *this;
}